

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O0

int __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
::select_variables(solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                   *this,rc_size *sizes,int bk)

{
  int *piVar1;
  int local_20;
  int local_1c;
  rc_size *prStack_18;
  int bk_local;
  rc_size *sizes_local;
  solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
  *this_local;
  
  local_20 = bk + sizes->c_size;
  local_1c = bk;
  prStack_18 = sizes;
  sizes_local = (rc_size *)this;
  piVar1 = std::min<int>(&local_20,&sizes->r_size);
  return *piVar1 + -1;
}

Assistant:

int select_variables(const rc_size& sizes, int bk)
    {
        // We need to affect all the bk variables even if the reduced cost sign
        // change.
        // For example: -v - w + x + y + z = 2
        // bk = 2, r_size = 5, c_size = 2
        // This function returns 1 i.e, we select the 0 and 1 variables.

        return std::min(bk + sizes.c_size, sizes.r_size) - 1;
    }